

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsimplifier.h
# Opt level: O3

void __thiscall
soplex::
SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxSimplifier(SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *old)

{
  TYPE ttype;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int32_t iVar7;
  Timer *pTVar8;
  
  this->_vptr_SPxSimplifier = (_func_int **)&PTR__SPxSimplifier_006a2210;
  this->m_name = old->m_name;
  ttype = old->m_timerType;
  iVar4 = old->m_remRows;
  iVar5 = old->m_remCols;
  iVar6 = old->m_remNzos;
  this->m_timerType = old->m_timerType;
  this->m_remRows = iVar4;
  this->m_remCols = iVar5;
  this->m_remNzos = iVar6;
  iVar4 = old->m_chgLRhs;
  iVar5 = old->m_keptBnds;
  iVar6 = old->m_keptLRhs;
  this->m_chgBnds = old->m_chgBnds;
  this->m_chgLRhs = iVar4;
  this->m_keptBnds = iVar5;
  this->m_keptLRhs = iVar6;
  uVar1 = *(undefined8 *)((old->m_objoffset).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_objoffset).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_objoffset).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_objoffset).m_backend.data._M_elems =
       *(undefined8 *)(old->m_objoffset).m_backend.data._M_elems;
  *(undefined8 *)((this->m_objoffset).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_objoffset).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_objoffset).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_objoffset).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_objoffset).m_backend.data._M_elems + 8);
  (this->m_objoffset).m_backend.exp = (old->m_objoffset).m_backend.exp;
  (this->m_objoffset).m_backend.neg = (old->m_objoffset).m_backend.neg;
  iVar7 = (old->m_objoffset).m_backend.prec_elem;
  (this->m_objoffset).m_backend.fpclass = (old->m_objoffset).m_backend.fpclass;
  (this->m_objoffset).m_backend.prec_elem = iVar7;
  uVar1 = *(undefined8 *)((old->m_minReduction).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_minReduction).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_minReduction).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_minReduction).m_backend.data._M_elems =
       *(undefined8 *)(old->m_minReduction).m_backend.data._M_elems;
  *(undefined8 *)((this->m_minReduction).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_minReduction).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_minReduction).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_minReduction).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_minReduction).m_backend.data._M_elems + 8);
  (this->m_minReduction).m_backend.exp = (old->m_minReduction).m_backend.exp;
  (this->m_minReduction).m_backend.neg = (old->m_minReduction).m_backend.neg;
  iVar7 = (old->m_minReduction).m_backend.prec_elem;
  (this->m_minReduction).m_backend.fpclass = (old->m_minReduction).m_backend.fpclass;
  (this->m_minReduction).m_backend.prec_elem = iVar7;
  this->spxout = old->spxout;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pTVar8 = TimerFactory::createTimer(ttype);
  this->m_timeUsed = pTVar8;
  return;
}

Assistant:

SPxSimplifier(const SPxSimplifier& old)
      : m_name(old.m_name)
      , m_timerType(old.m_timerType)
      , m_remRows(old.m_remRows)
      , m_remCols(old.m_remCols)
      , m_remNzos(old.m_remNzos)
      , m_chgBnds(old.m_chgBnds)
      , m_chgLRhs(old.m_chgLRhs)
      , m_keptBnds(old.m_keptBnds)
      , m_keptLRhs(old.m_keptLRhs)
      , m_objoffset(old.m_objoffset)
      , m_minReduction(old.m_minReduction)
      , spxout(old.spxout)
   {
      m_timeUsed = TimerFactory::createTimer(m_timerType);
      assert(isConsistent());
   }